

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::prune(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  string local_98 [32];
  ulong local_78;
  size_t pos2;
  ulong local_40;
  size_t pos;
  string newpath;
  Path *this_local;
  
  std::__cxx11::string::string((string *)&pos,(string *)this);
  local_40 = 0;
  do {
    while( true ) {
      local_40 = std::__cxx11::string::find((char *)&pos,0x1180e1);
      if (local_40 == 0xffffffffffffffff) {
        bVar2 = std::__cxx11::string::empty();
        if ((bVar2 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&pos,".");
        }
        std::__cxx11::string::string(local_98,(string *)&pos);
        Path(__return_storage_ptr__,(string *)local_98);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string((string *)&pos);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&pos2,(ulong)&pos);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pos2,"/..");
      std::__cxx11::string::~string((string *)&pos2);
      if (!bVar1) break;
      uVar3 = std::__cxx11::string::length();
      if ((local_40 + 3 < uVar3) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&pos), *pcVar4 != '/')) {
        local_40 = local_40 + 1;
      }
      else {
        if (local_40 == 0) {
          std::__cxx11::string::erase((ulong)&pos,0);
          bVar2 = std::__cxx11::string::empty();
          if ((bVar2 & 1) != 0) {
            std::__cxx11::string::append((char *)&pos);
          }
        }
        else {
          local_78 = 0;
          local_78 = std::__cxx11::string::rfind((char *)&pos,0x11817c);
          if (local_78 == 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&pos,0);
          }
          else {
            std::__cxx11::string::erase((ulong)&pos,local_78);
          }
        }
LAB_0010de5c:
        local_40 = 0;
      }
    }
    uVar3 = std::__cxx11::string::length();
    if ((uVar3 <= local_40 + 2) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&pos), *pcVar4 == '/')) {
      std::__cxx11::string::erase((ulong)&pos,local_40);
      bVar2 = std::__cxx11::string::empty();
      if ((bVar2 & 1) != 0) {
        std::__cxx11::string::append((char *)&pos);
      }
      goto LAB_0010de5c;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

Path Path::prune() const
{
  std::string newpath(m_path); // copy
  size_t pos = 0;
  while((pos = newpath.find("/.", pos)) != string::npos) { // assignment intended
    if (newpath.substr(pos, 3) == "/..") {

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 3 && newpath[pos + 3] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      if (pos == 0) {
        // /.. at beginning of string, replace with root / (/ on Windows is root on current drive)
        newpath.erase(pos, 3);

        // Whoops -- the entire string was just "/.."
        if (newpath.empty()) {
          newpath.append("/");
        }
      }
#ifdef _WIN32
      // Cater for paths with drive X:/ on Windows
      else if (pos == 2 && newpath[1] == ':') { // ":" is on Windows only allowed at pos 1, where it signifies the preceding char is a drive letter
        // X:/. or X:/.. at beginning of string
        if(newpath.length() > 4 && newpath[4] == '.') { // X:/..
          // Prevent special case "X:/..foo", which is directory "..foo" under the root
          if (newpath.length() <= 5 || newpath[5] != '/') {
            // X:/.. or X:/../foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 3);
          }
        }
        else { // X:/./foo/bar X:/..foo
          // Prevent special case "X:/.foo", which is directory ".foo" under the root
          if (newpath.length() <= 4 || newpath[4] != '/') {
            // X:/. or X:/./foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 2);
          }
        }

        if (newpath.length() == 2) {
          // Whoops -- the entire string was just "X:/.." or "X:/."
          newpath.append("/");
        }
      }
#endif
      else {
        size_t pos2 = 0;
        if ((pos2 = newpath.rfind("/", pos - 1)) != string::npos) { // assignment intended
          // Remove parent directory.
          newpath.erase(pos2, pos - pos2 + 3);
        }
        else { // ../ for relative path (as in foo/../baz.txt)
          newpath.erase(0, pos + 4);
        }
      }
    }
    else { // Single /.

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 2 && newpath[pos + 2] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      newpath.erase(pos, 2);

      // Whoops -- the entire string was just "/."
      if (newpath.empty()) {
        newpath.append("/");
      }
    }